

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

void * ubloxNMEAThread(void *pParam)

{
  int iVar1;
  int iVar2;
  long lVar3;
  CRITICAL_SECTION *__mutex;
  NMEADATA *__dest;
  NMEADATA nmeadata;
  NMEADATA NStack_408;
  
  __mutex = ubloxCS;
  __dest = nmeadataublox;
  lVar3 = 0;
  do {
    if (*(void **)((long)addrsublox + lVar3 * 2) == pParam) {
      iVar2 = 0;
      memset(&NStack_408,0,0x3d8);
      do {
        iVar1 = GetNMEASentenceublox((UBLOX *)pParam,&NStack_408);
        if (iVar1 != 0) {
          iVar2 = iVar1;
        }
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        memcpy(__dest,&NStack_408,0x3d8);
        *(int *)((long)resublox + lVar3) = iVar2;
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      } while (*(int *)((long)bExitNMEAublox + lVar3) == 0);
      return (void *)0x0;
    }
    __mutex = __mutex + 1;
    __dest = __dest + 1;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x40);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE ubloxNMEAThread(void* pParam)
{
	UBLOX* publox = (UBLOX*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	NMEADATA nmeadata;

	while (addrsublox[id] != publox)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	memset(&nmeadata, 0, sizeof(NMEADATA));
	for (;;)
	{
		//mSleep(publox->threadperiod);
		//memset(&nmeadata, 0, sizeof(NMEADATA));
		res = GetNMEASentenceublox(publox, &nmeadata);
		if (res != EXIT_SUCCESS) err = res;
		//if (GetNMEASentenceublox(publox, &nmeadata) == EXIT_SUCCESS)
		{
			EnterCriticalSection(&ubloxCS[id]);
			nmeadataublox[id] = nmeadata;
			resublox[id] = err;
			LeaveCriticalSection(&ubloxCS[id]);
		}
		if (bExitNMEAublox[id]) break;
	}

	return 0;
}